

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O3

CURLcode Curl_hsts_parse(hsts *h,char *hostname,char *header)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  hsts *h_00;
  _Bool _Var4;
  int iVar5;
  CURLofft CVar6;
  CURLcode CVar7;
  time_t tVar8;
  stsentry *psVar9;
  long lVar10;
  bool subdomains;
  char *pcVar11;
  curl_off_t expires;
  char *endp;
  curl_off_t local_58;
  time_t local_50;
  hsts *local_48;
  char *local_40;
  char *local_38;
  
  local_58 = 0;
  tVar8 = time((time_t *)0x0);
  _Var4 = Curl_host_is_ipnum(hostname);
  CVar7 = CURLE_OK;
  if (!_Var4) {
    bVar3 = false;
    subdomains = false;
    local_50 = tVar8;
    local_48 = h;
    local_40 = hostname;
    do {
      for (; (*header == ' ' || (*header == '\t')); header = header + 1) {
      }
      iVar5 = curl_strnequal("max-age=",header,8);
      if (iVar5 == 0) {
        iVar5 = curl_strnequal("includesubdomains",header,0x11);
        if (iVar5 == 0) {
          for (; (*header != '\0' && (*header != ';')); header = header + 1) {
          }
        }
        else {
          if (subdomains) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          header = header + 0x11;
          subdomains = true;
        }
      }
      else {
        if (bVar3) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        for (pcVar11 = header + 8; (cVar2 = *pcVar11, cVar2 == ' ' || (cVar2 == '\t'));
            pcVar11 = pcVar11 + 1) {
        }
        CVar6 = curlx_strtoofft(pcVar11 + (cVar2 == '\"'),&local_38,10,&local_58);
        if (CVar6 != CURL_OFFT_OK) {
          if (CVar6 != CURL_OFFT_FLOW) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          local_58 = 0x7fffffffffffffff;
        }
        header = local_38;
        if (cVar2 == '\"') {
          if (*local_38 != '\"') {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          header = local_38 + 1;
        }
        bVar3 = true;
      }
      for (; (pcVar11 = local_40, h_00 = local_48, cVar2 = *header, cVar2 == ' ' || (cVar2 == '\t'))
          ; header = header + 1) {
      }
      pcVar1 = header + (cVar2 == ';');
      header = header + (cVar2 == ';');
    } while (*pcVar1 != '\0');
    CVar7 = CURLE_BAD_FUNCTION_ARGUMENT;
    if (bVar3) {
      if (local_58 == 0) {
        psVar9 = Curl_hsts(local_48,local_40,false);
        CVar7 = CURLE_OK;
        if (psVar9 != (stsentry *)0x0) {
          Curl_node_remove(&psVar9->node);
          (*Curl_cfree)(psVar9->host);
          (*Curl_cfree)(psVar9);
          CVar7 = CURLE_OK;
        }
      }
      else {
        lVar10 = local_50 + local_58;
        if (0x7fffffffffffffff - local_50 < local_58) {
          lVar10 = 0x7fffffffffffffff;
        }
        local_58 = lVar10;
        psVar9 = Curl_hsts(local_48,local_40,false);
        if (psVar9 == (stsentry *)0x0) {
          CVar7 = hsts_create(h_00,pcVar11,subdomains,local_58);
        }
        else {
          psVar9->expires = local_58;
          psVar9->includeSubDomains = subdomains;
          CVar7 = CURLE_OK;
        }
      }
    }
  }
  return CVar7;
}

Assistant:

CURLcode Curl_hsts_parse(struct hsts *h, const char *hostname,
                         const char *header)
{
  const char *p = header;
  curl_off_t expires = 0;
  bool gotma = FALSE;
  bool gotinc = FALSE;
  bool subdomains = FALSE;
  struct stsentry *sts;
  time_t now = time(NULL);

  if(Curl_host_is_ipnum(hostname))
    /* "explicit IP address identification of all forms is excluded."
       / RFC 6797 */
    return CURLE_OK;

  do {
    while(*p && ISBLANK(*p))
      p++;
    if(strncasecompare("max-age=", p, 8)) {
      bool quoted = FALSE;
      CURLofft offt;
      char *endp;

      if(gotma)
        return CURLE_BAD_FUNCTION_ARGUMENT;

      p += 8;
      while(*p && ISBLANK(*p))
        p++;
      if(*p == '\"') {
        p++;
        quoted = TRUE;
      }
      offt = curlx_strtoofft(p, &endp, 10, &expires);
      if(offt == CURL_OFFT_FLOW)
        expires = CURL_OFF_T_MAX;
      else if(offt)
        /* invalid max-age */
        return CURLE_BAD_FUNCTION_ARGUMENT;
      p = endp;
      if(quoted) {
        if(*p != '\"')
          return CURLE_BAD_FUNCTION_ARGUMENT;
        p++;
      }
      gotma = TRUE;
    }
    else if(strncasecompare("includesubdomains", p, 17)) {
      if(gotinc)
        return CURLE_BAD_FUNCTION_ARGUMENT;
      subdomains = TRUE;
      p += 17;
      gotinc = TRUE;
    }
    else {
      /* unknown directive, do a lame attempt to skip */
      while(*p && (*p != ';'))
        p++;
    }

    while(*p && ISBLANK(*p))
      p++;
    if(*p == ';')
      p++;
  } while(*p);

  if(!gotma)
    /* max-age is mandatory */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(!expires) {
    /* remove the entry if present verbatim (without subdomain match) */
    sts = Curl_hsts(h, hostname, FALSE);
    if(sts) {
      Curl_node_remove(&sts->node);
      hsts_free(sts);
    }
    return CURLE_OK;
  }

  if(CURL_OFF_T_MAX - now < expires)
    /* would overflow, use maximum value */
    expires = CURL_OFF_T_MAX;
  else
    expires += now;

  /* check if it already exists */
  sts = Curl_hsts(h, hostname, FALSE);
  if(sts) {
    /* just update these fields */
    sts->expires = expires;
    sts->includeSubDomains = subdomains;
  }
  else
    return hsts_create(h, hostname, subdomains, expires);

  return CURLE_OK;
}